

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  LogMessage *pLVar1;
  Reflection *reflection;
  TextGenerator generator;
  StringOutputStream output_stream;
  
  if (output == (string *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&generator,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/text_format.cc"
               ,0x8a7);
    pLVar1 = internal::LogMessage::operator<<((LogMessage *)&generator,"CHECK failed: output: ");
    pLVar1 = internal::LogMessage::operator<<(pLVar1,"output specified is nullptr");
    internal::LogFinisher::operator=((LogFinisher *)&output_stream,pLVar1);
    internal::LogMessage::~LogMessage((LogMessage *)&generator);
  }
  output->_M_string_length = 0;
  *(output->_M_dataplus)._M_p = '\0';
  io::StringOutputStream::StringOutputStream(&output_stream,output);
  generator.indent_level_ = this->initial_indent_level_;
  generator.super_BaseTextGenerator._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_004df940;
  generator.buffer_ = (char *)0x0;
  generator.buffer_size_ = 0;
  generator.at_start_of_line_ = true;
  generator.failed_ = false;
  generator.insert_silent_marker_ = false;
  generator.output_ = &output_stream.super_ZeroCopyOutputStream;
  generator.initial_indent_level_ = generator.indent_level_;
  (*(message->super_MessageLite)._vptr_MessageLite[0x11])(message);
  PrintFieldValue(this,message,reflection,field,index,&generator);
  TextGenerator::~TextGenerator(&generator);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(const Message& message,
                                                  const FieldDescriptor* field,
                                                  int index,
                                                  std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, &generator);
}